

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fColorClearTest.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::ColorClearTest::init(ColorClearTest *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ColorClearCase *pCVar1;
  
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"single_rgb",0x1e,1,3,false,false,false,
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"single_rgba",0x1e,1,3,true,false,false,
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"multiple_rgb",0xf,4,0x14,false,false,
             false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"multiple_rgba",0xf,4,0x14,true,false,
             false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"long_rgb",2,100,500,false,false,false,
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"long_rgba",2,100,500,true,false,false,
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"subclears_rgb",0xf,4,0x1e,false,false,
             false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"subclears_rgba",0xf,4,0x1e,true,false,
             false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"short_scissored_rgb",0x1e,2,4,false,true,
             false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"scissored_rgb",0xf,4,0x1e,false,true,
             false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"scissored_rgba",0xf,4,0x1e,true,true,
             false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"masked_rgb",0xf,4,0x1e,false,true,false,
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"masked_rgba",0xf,4,0x1e,true,true,false,
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"masked_scissored_rgb",0xf,4,0x1e,false,
             true,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"masked_scissored_rgba",0xf,4,0x1e,true,
             true,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"complex_rgb",0xf,5,0x32,false,true,true,
             false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"complex_rgba",0xf,5,0x32,true,true,true,
             false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"long_masked_rgb",2,100,500,false,true,
             true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ColorClearCase *)operator_new(0x90);
  ColorClearCase::ColorClearCase
            (pCVar1,(this->super_TestCaseGroup).m_context,"long_masked_rgba",2,100,500,true,true,
             true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  return extraout_EAX;
}

Assistant:

void ColorClearTest::init (void)
{
	//										name					iters,	#..#,		alpha?,	scissor,masks,	1stfull?
	addChild(new ColorClearCase(m_context, "single_rgb",			30,		1,3,		false,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "single_rgba",			30,		1,3,		true,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "multiple_rgb",			15,		4,20,		false,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "multiple_rgba",			15,		4,20,		true,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "long_rgb",				2,		100,500,	false,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "long_rgba",				2,		100,500,	true,	false,	false,	true	));
	addChild(new ColorClearCase(m_context, "subclears_rgb",			15,		4,30,		false,	false,	false,	false	));
	addChild(new ColorClearCase(m_context, "subclears_rgba",		15,		4,30,		true,	false,	false,	false	));
	addChild(new ColorClearCase(m_context, "short_scissored_rgb",	30,		2,4,		false,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "scissored_rgb",			15,		4,30,		false,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "scissored_rgba",		15,		4,30,		true,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "masked_rgb",			15,		4,30,		false,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "masked_rgba",			15,		4,30,		true,	true,	false,	true	));
	addChild(new ColorClearCase(m_context, "masked_scissored_rgb",	15,		4,30,		false,	true,	true,	true	));
	addChild(new ColorClearCase(m_context, "masked_scissored_rgba",	15,		4,30,		true,	true,	true,	true	));
	addChild(new ColorClearCase(m_context, "complex_rgb",			15,		5,50,		false,	true,	true,	false	));
	addChild(new ColorClearCase(m_context, "complex_rgba",			15,		5,50,		true,	true,	true,	false	));
	addChild(new ColorClearCase(m_context, "long_masked_rgb",		2,		100,500,	false,	true,	true,	true	));
	addChild(new ColorClearCase(m_context, "long_masked_rgba",		2,		100,500,	true,	true,	true,	true	));
}